

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space.h
# Opt level: O0

int __thiscall
projects::dpg::ProductUniformFESpace<double>::init
          (ProductUniformFESpace<double> *this,EVP_PKEY_CTX *ctx)

{
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  int iVar4;
  value_type vVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  element_type *peVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var12;
  element_type *peVar13;
  ostream *poVar14;
  reference this_00;
  undefined1 local_2038 [12];
  RefEl local_202c;
  RefEl local_202b;
  RefEl local_202a;
  RefEl local_2029;
  pair<const_lf::base::RefEl,_unsigned_int> local_2028;
  pair<const_lf::base::RefEl,_unsigned_int> local_2020;
  pair<const_lf::base::RefEl,_unsigned_int> local_2018;
  pair<const_lf::base::RefEl,_unsigned_int> local_2010;
  iterator local_2008;
  size_type local_2000;
  uint local_1ff8;
  allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>
  local_1ff1;
  size_type component_1;
  vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
  rsf_layouts;
  string local_1fd0;
  allocator<char> local_1fa9;
  string local_1fa8;
  allocator<char> local_1f81;
  string local_1f80;
  string local_1f60;
  allocator<char> local_1f39;
  string local_1f38;
  allocator<char> local_1f11;
  string local_1f10;
  stringstream local_1ef0 [8];
  stringstream ss_12;
  ostream local_1ee0 [383];
  allocator<char> local_1d61;
  string local_1d60;
  allocator<char> local_1d39;
  string local_1d38;
  allocator<char> local_1d11;
  string local_1d10;
  string local_1cf0;
  allocator<char> local_1cc9;
  string local_1cc8;
  allocator<char> local_1ca1;
  string local_1ca0;
  stringstream local_1c80 [8];
  stringstream ss_11;
  ostream local_1c70 [383];
  allocator<char> local_1af1;
  string local_1af0;
  allocator<char> local_1ac9;
  string local_1ac8;
  allocator<char> local_1aa1;
  string local_1aa0;
  string local_1a80;
  allocator<char> local_1a59;
  string local_1a58;
  allocator<char> local_1a31;
  string local_1a30;
  stringstream local_1a10 [8];
  stringstream ss_10;
  ostream local_1a00 [383];
  allocator<char> local_1881;
  string local_1880;
  allocator<char> local_1859;
  string local_1858;
  allocator<char> local_1831;
  string local_1830;
  string local_1810;
  allocator<char> local_17e9;
  string local_17e8;
  allocator<char> local_17c1;
  string local_17c0;
  stringstream local_17a0 [8];
  stringstream ss_9;
  ostream local_1790 [383];
  allocator<char> local_1611;
  string local_1610;
  allocator<char> local_15e9;
  string local_15e8;
  allocator<char> local_15c1;
  string local_15c0;
  string local_15a0;
  allocator<char> local_1579;
  string local_1578;
  allocator<char> local_1551;
  string local_1550;
  stringstream local_1530 [8];
  stringstream ss_8;
  ostream local_1520 [383];
  allocator<char> local_13a1;
  string local_13a0;
  allocator<char> local_1379;
  string local_1378;
  allocator<char> local_1351;
  string local_1350;
  string local_1330;
  allocator<char> local_1309;
  string local_1308;
  allocator<char> local_12e1;
  string local_12e0;
  stringstream local_12c0 [8];
  stringstream ss_7;
  ostream local_12b0 [383];
  allocator<char> local_1131;
  string local_1130;
  allocator<char> local_1109;
  string local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  allocator<char> local_1071;
  string local_1070;
  stringstream local_1050 [8];
  stringstream ss_6;
  ostream local_1040 [381];
  RefEl local_ec3;
  RefEl local_ec2;
  allocator<char> local_ec1;
  string local_ec0;
  allocator<char> local_e99;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  allocator<char> local_e01;
  string local_e00;
  stringstream local_de0 [8];
  stringstream ss_5;
  ostream local_dd0 [381];
  RefEl local_c53;
  RefEl local_c52;
  allocator<char> local_c51;
  string local_c50;
  allocator<char> local_c29;
  string local_c28;
  allocator<char> local_c01;
  string local_c00;
  string local_be0;
  allocator<char> local_bb9;
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  stringstream local_b70 [8];
  stringstream ss_4;
  ostream local_b60 [382];
  RefEl local_9e2;
  RefEl local_9e1;
  uint local_9e0;
  allocator<char> local_9d9;
  size_type component;
  allocator<char> local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  stringstream local_8f8 [8];
  stringstream ss_3;
  ostream local_8e8 [383];
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  stringstream local_688 [8];
  stringstream ss_2;
  ostream local_678 [383];
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  stringstream local_418 [8];
  stringstream ss_1;
  ostream local_408 [383];
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  ProductUniformFESpace<double> *local_10;
  ProductUniformFESpace<double> *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->mesh_p_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"No mesh");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"mesh_p_ != nullptr",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0xd4,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"false",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
    lf::base::AssertionFailed(&local_238,&local_260,0xd4,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    abort();
  }
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  iVar4 = (**peVar8->_vptr_Mesh)();
  if (iVar4 != 2) {
    std::__cxx11::stringstream::stringstream(local_418);
    std::operator<<(local_408,"Only 2D cells");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"mesh_p_->DimMesh() == 2",&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_461);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_438,&local_460,0xd5,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"false",&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"",&local_4f9);
    lf::base::AssertionFailed(&local_4a8,&local_4d0,0xd5,&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    abort();
  }
  if (this->numComponents_ == 0) {
    std::__cxx11::stringstream::stringstream(local_688);
    std::operator<<(local_678,"0 components FE space.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"numComponents_ != 0",&local_6a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_6d1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_6a8,&local_6d0,0xdc,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator(&local_6a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"false",&local_719);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_741);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_769);
    lf::base::AssertionFailed(&local_718,&local_740,0xdc,&local_768);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator(&local_741);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator(&local_719);
    abort();
  }
  uVar7 = this->numComponents_;
  sVar9 = std::
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          ::size(&this->rfs_tria_v_);
  if ((((uVar7 == sVar9) &&
       (uVar7 = this->numComponents_,
       sVar9 = std::
               vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
               ::size(&this->rfs_quad_v_), uVar7 == sVar9)) &&
      (uVar7 = this->numComponents_,
      sVar9 = std::
              vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
              ::size(&this->rfs_edge_v_), uVar7 == sVar9)) &&
     (uVar7 = this->numComponents_,
     sVar9 = std::
             vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
             ::size(&this->rfs_point_v_), uVar7 == sVar9)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->num_rsf_tria_,(ulong)this->numComponents_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->num_rsf_quad_,(ulong)this->numComponents_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->num_rsf_edge_,(ulong)this->numComponents_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->num_rsf_node_,(ulong)this->numComponents_);
    local_9e0 = 0;
    do {
      if (this->numComponents_ <= local_9e0) {
        uVar7 = this->numComponents_;
        std::
        allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>
        ::allocator(&local_1ff1);
        std::
        vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
        ::vector((vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                  *)&component_1,(ulong)uVar7,&local_1ff1);
        std::
        allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>
        ::~allocator(&local_1ff1);
        for (local_1ff8 = 0; local_1ff8 < this->numComponents_; local_1ff8 = local_1ff8 + 1) {
          local_2029 = lf::base::RefEl::kPoint();
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->num_rsf_node_,(ulong)local_1ff8);
          std::pair<const_lf::base::RefEl,_unsigned_int>::
          pair<lf::base::RefEl,_unsigned_int_&,_true>(&local_2028,&local_2029,pvVar10);
          local_202a = lf::base::RefEl::kSegment();
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->num_rsf_edge_,(ulong)local_1ff8);
          std::pair<const_lf::base::RefEl,_unsigned_int>::
          pair<lf::base::RefEl,_unsigned_int_&,_true>(&local_2020,&local_202a,pvVar10);
          local_202b = lf::base::RefEl::kTria();
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->num_rsf_tria_,(ulong)local_1ff8);
          std::pair<const_lf::base::RefEl,_unsigned_int>::
          pair<lf::base::RefEl,_unsigned_int_&,_true>(&local_2018,&local_202b,pvVar10);
          local_202c = lf::base::RefEl::kQuad();
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->num_rsf_quad_,(ulong)local_1ff8);
          std::pair<const_lf::base::RefEl,_unsigned_int>::
          pair<lf::base::RefEl,_unsigned_int_&,_true>(&local_2010,&local_202c,pvVar10);
          local_2008 = &local_2028;
          local_2000 = 4;
          this_00 = std::
                    vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                    ::operator[]((vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                                  *)&component_1,(ulong)local_1ff8);
          __l._M_len = local_2000;
          __l._M_array = local_2008;
          std::
          map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
          ::operator=(this_00,__l);
        }
        std::
        make_unique<projects::dpg::ProductUniformFEDofHandler,std::shared_ptr<lf::mesh::Mesh_const>&,std::vector<std::map<lf::base::RefEl,unsigned_int,std::less<lf::base::RefEl>,std::allocator<std::pair<lf::base::RefEl_const,unsigned_int>>>,std::allocator<std::map<lf::base::RefEl,unsigned_int,std::less<lf::base::RefEl>,std::allocator<std::pair<lf::base::RefEl_const,unsigned_int>>>>>&>
                  ((shared_ptr<const_lf::mesh::Mesh> *)local_2038,
                   (vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                    *)&this->mesh_p_);
        std::
        unique_ptr<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
        ::operator=(&this->dofh_p_,
                    (unique_ptr<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
                     *)local_2038);
        std::
        unique_ptr<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
        ::~unique_ptr((unique_ptr<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
                       *)local_2038);
        std::
        vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
        ::~vector((vector<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                   *)&component_1);
        return extraout_EAX;
      }
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->num_rsf_tria_,(ulong)local_9e0);
      *pvVar10 = 0;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->num_rsf_quad_,(ulong)local_9e0);
      *pvVar10 = 0;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->num_rsf_edge_,(ulong)local_9e0);
      *pvVar10 = 0;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->num_rsf_node_,(ulong)local_9e0);
      *pvVar10 = 0;
      pvVar11 = std::
                vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
      bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[2])();
        local_9e1.type_ = (RefElType)iVar4;
        RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_9e1);
        local_9e2 = lf::base::RefEl::kTria();
        RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_9e2);
        if (RVar2 != RVar3) {
          std::__cxx11::stringstream::stringstream(local_b70);
          poVar14 = std::operator<<(local_b60,"wrong type for triangle in component");
          std::ostream::operator<<(poVar14,local_9e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b90,
                     "rfs_tria_v_[component]->RefEl() == lf::base::RefEl::kTria()",&local_b91);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bb8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                     ,&local_bb9);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_b90,&local_bb8,0xf5,&local_be0);
          std::__cxx11::string::~string((string *)&local_be0);
          std::__cxx11::string::~string((string *)&local_bb8);
          std::allocator<char>::~allocator(&local_bb9);
          std::__cxx11::string::~string((string *)&local_b90);
          std::allocator<char>::~allocator(&local_b91);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c00,"false",&local_c01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c28,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                     ,&local_c29);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"",&local_c51);
          lf::base::AssertionFailed(&local_c00,&local_c28,0xf5,&local_c50);
          std::__cxx11::string::~string((string *)&local_c50);
          std::allocator<char>::~allocator(&local_c51);
          std::__cxx11::string::~string((string *)&local_c28);
          std::allocator<char>::~allocator(&local_c29);
          std::__cxx11::string::~string((string *)&local_c00);
          std::allocator<char>::~allocator(&local_c01);
          abort();
        }
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_node_,(ulong)local_9e0);
        *pvVar10 = vVar5;
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_edge_,(ulong)local_9e0);
        *pvVar10 = vVar5;
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_tria_,(ulong)local_9e0);
        *pvVar10 = vVar5;
      }
      pvVar11 = std::
                vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
      bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[2])();
        local_c52.type_ = (RefElType)iVar4;
        RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_c52);
        local_c53 = lf::base::RefEl::kQuad();
        RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_c53);
        if (RVar2 != RVar3) {
          std::__cxx11::stringstream::stringstream(local_de0);
          poVar14 = std::operator<<(local_dd0,"Wrong type for quad in component ");
          std::ostream::operator<<(poVar14,local_9e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e00,
                     "rfs_quad_v_[component]->RefEl() == lf::base::RefEl::kQuad()",&local_e01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e28,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                     ,&local_e29);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_e00,&local_e28,0x101,&local_e50);
          std::__cxx11::string::~string((string *)&local_e50);
          std::__cxx11::string::~string((string *)&local_e28);
          std::allocator<char>::~allocator(&local_e29);
          std::__cxx11::string::~string((string *)&local_e00);
          std::allocator<char>::~allocator(&local_e01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e70,"false",&local_e71);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e98,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                     ,&local_e99);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ec0,"",&local_ec1);
          lf::base::AssertionFailed(&local_e70,&local_e98,0x101,&local_ec0);
          std::__cxx11::string::~string((string *)&local_ec0);
          std::allocator<char>::~allocator(&local_ec1);
          std::__cxx11::string::~string((string *)&local_e98);
          std::allocator<char>::~allocator(&local_e99);
          std::__cxx11::string::~string((string *)&local_e70);
          std::allocator<char>::~allocator(&local_e71);
          abort();
        }
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_node_,(ulong)local_9e0);
        *pvVar10 = vVar5;
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_edge_,(ulong)local_9e0);
        *pvVar10 = vVar5;
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_quad_,(ulong)local_9e0);
        *pvVar10 = vVar5;
      }
      pvVar11 = std::
                vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
      bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[2])();
        local_ec2.type_ = (RefElType)iVar4;
        RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_ec2);
        local_ec3 = lf::base::RefEl::kSegment();
        RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_ec3);
        if (RVar2 != RVar3) {
          std::__cxx11::stringstream::stringstream(local_1050);
          poVar14 = std::operator<<(local_1040,"Wrong type for edge in component ");
          std::ostream::operator<<(poVar14,local_9e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1070,
                     "rfs_edge_v_[component]->RefEl() == lf::base::RefEl::kSegment()",&local_1071);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1098,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                     ,&local_1099);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_1070,&local_1098,0x10d,&local_10c0);
          std::__cxx11::string::~string((string *)&local_10c0);
          std::__cxx11::string::~string((string *)&local_1098);
          std::allocator<char>::~allocator(&local_1099);
          std::__cxx11::string::~string((string *)&local_1070);
          std::allocator<char>::~allocator(&local_1071);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10e0,"false",&local_10e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1108,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                     ,&local_1109);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1130,"",&local_1131);
          lf::base::AssertionFailed(&local_10e0,&local_1108,0x10d,&local_1130);
          std::__cxx11::string::~string((string *)&local_1130);
          std::allocator<char>::~allocator(&local_1131);
          std::__cxx11::string::~string((string *)&local_1108);
          std::allocator<char>::~allocator(&local_1109);
          std::__cxx11::string::~string((string *)&local_10e0);
          std::allocator<char>::~allocator(&local_10e1);
          abort();
        }
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_node_,(ulong)local_9e0);
        *pvVar10 = vVar5;
        p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
        peVar13 = std::
                  __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var12);
        vVar5 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->num_rsf_edge_,(ulong)local_9e0);
        *pvVar10 = vVar5;
      }
      pvVar11 = std::
                vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
      bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar11 = std::
                  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                  ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
        bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar6 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream(local_12c0);
            poVar14 = std::operator<<(local_12b0,"#RSF missmatch on nodes in component");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_9e0);
            poVar14 = std::operator<<(poVar14,": ");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar7);
            poVar14 = std::operator<<(poVar14,"<->");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
            std::ostream::operator<<(poVar14,uVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_12e0,
                       "(rfs_tria_v_[component]->NumRefShapeFunctions(2)) == (rfs_quad_v_[component]->NumRefShapeFunctions(2))"
                       ,&local_12e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1308,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1309);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_12e0,&local_1308,0x11f,&local_1330);
            std::__cxx11::string::~string((string *)&local_1330);
            std::__cxx11::string::~string((string *)&local_1308);
            std::allocator<char>::~allocator(&local_1309);
            std::__cxx11::string::~string((string *)&local_12e0);
            std::allocator<char>::~allocator(&local_12e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1350,"false",&local_1351);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1378,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1379);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_13a0,"",&local_13a1)
            ;
            lf::base::AssertionFailed(&local_1350,&local_1378,0x11f,&local_13a0);
            std::__cxx11::string::~string((string *)&local_13a0);
            std::allocator<char>::~allocator(&local_13a1);
            std::__cxx11::string::~string((string *)&local_1378);
            std::allocator<char>::~allocator(&local_1379);
            std::__cxx11::string::~string((string *)&local_1350);
            std::allocator<char>::~allocator(&local_1351);
            abort();
          }
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar6 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream(local_1530);
            poVar14 = std::operator<<(local_1520,"#RSF missmatch on edges in component");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_9e0);
            poVar14 = std::operator<<(poVar14,": ");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar7);
            poVar14 = std::operator<<(poVar14,"<->");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
            std::ostream::operator<<(poVar14,uVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1550,
                       "(rfs_tria_v_[component]->NumRefShapeFunctions(1)) == (rfs_quad_v_[component]->NumRefShapeFunctions(1))"
                       ,&local_1551);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1578,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1579);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1550,&local_1578,0x126,&local_15a0);
            std::__cxx11::string::~string((string *)&local_15a0);
            std::__cxx11::string::~string((string *)&local_1578);
            std::allocator<char>::~allocator(&local_1579);
            std::__cxx11::string::~string((string *)&local_1550);
            std::allocator<char>::~allocator(&local_1551);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_15c0,"false",&local_15c1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_15e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_15e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1610,"",&local_1611)
            ;
            lf::base::AssertionFailed(&local_15c0,&local_15e8,0x126,&local_1610);
            std::__cxx11::string::~string((string *)&local_1610);
            std::allocator<char>::~allocator(&local_1611);
            std::__cxx11::string::~string((string *)&local_15e8);
            std::allocator<char>::~allocator(&local_15e9);
            std::__cxx11::string::~string((string *)&local_15c0);
            std::allocator<char>::~allocator(&local_15c1);
            abort();
          }
        }
      }
      pvVar11 = std::
                vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
      bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar11 = std::
                  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                  ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
        bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar6 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream(local_17a0);
            poVar14 = std::operator<<(local_1790,"#RSF missmatch on nodes in component");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_9e0);
            poVar14 = std::operator<<(poVar14,": ");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar7);
            poVar14 = std::operator<<(poVar14,"<->");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
            std::ostream::operator<<(poVar14,uVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_17c0,
                       "(rfs_tria_v_[component]->NumRefShapeFunctions(2)) == (rfs_edge_v_[component]->NumRefShapeFunctions(1))"
                       ,&local_17c1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_17e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_17e9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_17c0,&local_17e8,0x130,&local_1810);
            std::__cxx11::string::~string((string *)&local_1810);
            std::__cxx11::string::~string((string *)&local_17e8);
            std::allocator<char>::~allocator(&local_17e9);
            std::__cxx11::string::~string((string *)&local_17c0);
            std::allocator<char>::~allocator(&local_17c1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1830,"false",&local_1831);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1858,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1859);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1880,"",&local_1881)
            ;
            lf::base::AssertionFailed(&local_1830,&local_1858,0x130,&local_1880);
            std::__cxx11::string::~string((string *)&local_1880);
            std::allocator<char>::~allocator(&local_1881);
            std::__cxx11::string::~string((string *)&local_1858);
            std::allocator<char>::~allocator(&local_1859);
            std::__cxx11::string::~string((string *)&local_1830);
            std::allocator<char>::~allocator(&local_1831);
            abort();
          }
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar6 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream(local_1a10);
            poVar14 = std::operator<<(local_1a00,"#RSF missmatch on edges in component");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_9e0);
            poVar14 = std::operator<<(poVar14,": ");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_tria_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar7);
            poVar14 = std::operator<<(poVar14,"<->");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
            std::ostream::operator<<(poVar14,uVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a30,
                       "(rfs_tria_v_[component]->NumRefShapeFunctions(1)) == (rfs_edge_v_[component]->NumRefShapeFunctions(0))"
                       ,&local_1a31);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a58,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1a59);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1a30,&local_1a58,0x137,&local_1a80);
            std::__cxx11::string::~string((string *)&local_1a80);
            std::__cxx11::string::~string((string *)&local_1a58);
            std::allocator<char>::~allocator(&local_1a59);
            std::__cxx11::string::~string((string *)&local_1a30);
            std::allocator<char>::~allocator(&local_1a31);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1aa0,"false",&local_1aa1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1ac8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1ac9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1af0,"",&local_1af1)
            ;
            lf::base::AssertionFailed(&local_1aa0,&local_1ac8,0x137,&local_1af0);
            std::__cxx11::string::~string((string *)&local_1af0);
            std::allocator<char>::~allocator(&local_1af1);
            std::__cxx11::string::~string((string *)&local_1ac8);
            std::allocator<char>::~allocator(&local_1ac9);
            std::__cxx11::string::~string((string *)&local_1aa0);
            std::allocator<char>::~allocator(&local_1aa1);
            abort();
          }
        }
      }
      pvVar11 = std::
                vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
      bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar11 = std::
                  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                  ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
        bVar1 = std::operator==(pvVar11,(nullptr_t)0x0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar6 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream(local_1c80);
            poVar14 = std::operator<<(local_1c70,"#RSF missmatch on nodes in component");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_9e0);
            poVar14 = std::operator<<(poVar14,": ");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,2);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar7);
            poVar14 = std::operator<<(poVar14,"<->");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
            std::ostream::operator<<(poVar14,uVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1ca0,
                       "(rfs_quad_v_[component]->NumRefShapeFunctions(2)) == (rfs_edge_v_[component]->NumRefShapeFunctions(1))"
                       ,&local_1ca1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1cc8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1cc9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1ca0,&local_1cc8,0x141,&local_1cf0);
            std::__cxx11::string::~string((string *)&local_1cf0);
            std::__cxx11::string::~string((string *)&local_1cc8);
            std::allocator<char>::~allocator(&local_1cc9);
            std::__cxx11::string::~string((string *)&local_1ca0);
            std::allocator<char>::~allocator(&local_1ca1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d10,"false",&local_1d11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d38,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1d39);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d60,"",&local_1d61)
            ;
            lf::base::AssertionFailed(&local_1d10,&local_1d38,0x141,&local_1d60);
            std::__cxx11::string::~string((string *)&local_1d60);
            std::allocator<char>::~allocator(&local_1d61);
            std::__cxx11::string::~string((string *)&local_1d38);
            std::allocator<char>::~allocator(&local_1d39);
            std::__cxx11::string::~string((string *)&local_1d10);
            std::allocator<char>::~allocator(&local_1d11);
            abort();
          }
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar4 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
          p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                       ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
          peVar13 = std::
                    __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var12);
          iVar6 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream(local_1ef0);
            poVar14 = std::operator<<(local_1ee0,"#RSF missmatch on edges in component");
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_9e0);
            poVar14 = std::operator<<(poVar14,": ");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_quad_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,1);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar7);
            poVar14 = std::operator<<(poVar14,"<->");
            p_Var12 = (__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                         ::operator[](&this->rfs_edge_v_,(ulong)local_9e0);
            peVar13 = std::
                      __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            uVar7 = (*peVar13->_vptr_ScalarReferenceFiniteElement[5])(peVar13,0);
            std::ostream::operator<<(poVar14,uVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f10,
                       "(rfs_quad_v_[component]->NumRefShapeFunctions(1)) == (rfs_edge_v_[component]->NumRefShapeFunctions(0))"
                       ,&local_1f11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f38,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1f39);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1f10,&local_1f38,0x148,&local_1f60);
            std::__cxx11::string::~string((string *)&local_1f60);
            std::__cxx11::string::~string((string *)&local_1f38);
            std::allocator<char>::~allocator(&local_1f39);
            std::__cxx11::string::~string((string *)&local_1f10);
            std::allocator<char>::~allocator(&local_1f11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f80,"false",&local_1f81);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1fa8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
                       ,&local_1fa9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1fd0,"",
                       (allocator<char> *)
                       ((long)&rsf_layouts.
                               super__Vector_base<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            lf::base::AssertionFailed(&local_1f80,&local_1fa8,0x148,&local_1fd0);
            std::__cxx11::string::~string((string *)&local_1fd0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&rsf_layouts.
                               super__Vector_base<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>,_std::allocator<std::map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            std::__cxx11::string::~string((string *)&local_1fa8);
            std::allocator<char>::~allocator(&local_1fa9);
            std::__cxx11::string::~string((string *)&local_1f80);
            std::allocator<char>::~allocator(&local_1f81);
            abort();
          }
        }
      }
      local_9e0 = local_9e0 + 1;
    } while( true );
  }
  std::__cxx11::stringstream::stringstream(local_8f8);
  std::operator<<(local_8e8,
                  "Missmatch in number of shape functions passed for different entity tpyes.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,
             "numComponents_ == rfs_tria_v_.size() && numComponents_ == rfs_quad_v_.size() && numComponents_ == rfs_edge_v_.size() && numComponents_ == rfs_point_v_.size()"
             ,&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
             ,&local_941);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_918,&local_940,0xe2,&local_968);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"false",&local_989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
             ,&local_9b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&component,"",&local_9d9);
  lf::base::AssertionFailed(&local_988,&local_9b0,0xe2,(string *)&component);
  std::__cxx11::string::~string((string *)&component);
  std::allocator<char>::~allocator(&local_9d9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
  abort();
}

Assistant:

void ProductUniformFESpace<SCALAR>::init() {
  // check validity and consistency of mesh pointer:
  LF_ASSERT_MSG(mesh_p_ != nullptr, "No mesh");
  LF_ASSERT_MSG(mesh_p_->DimMesh() == 2, "Only 2D cells");

  // we do not check, wheter a specification of reference finite elements
  // for cells (triangles and quadrilaterals) is given, since this may not
  // be desired necessary for some components in  a dpg method (fluxes)

  // check validity and consistency of the number of components:
  LF_ASSERT_MSG(numComponents_ != 0, "0 components FE space.");
  LF_ASSERT_MSG(numComponents_ == rfs_tria_v_.size() &&
                    numComponents_ == rfs_quad_v_.size() &&
                    numComponents_ == rfs_edge_v_.size() &&
                    numComponents_ == rfs_point_v_.size(),
                "Missmatch in number of shape functions passed for different "
                "entity tpyes.");

  // resize vectors saving the number of loal shape functions for each
  // component:
  num_rsf_tria_.resize(numComponents_);
  num_rsf_quad_.resize(numComponents_);
  num_rsf_edge_.resize(numComponents_);
  num_rsf_node_.resize(numComponents_);

  // compatibility checks and initialization of number of shape functions:
  for (size_type component = 0; component < numComponents_; component++) {
    num_rsf_tria_[component] = 0;
    num_rsf_quad_[component] = 0;
    num_rsf_edge_[component] = 0;
    num_rsf_node_[component] = 0;

    if (rfs_tria_v_[component] != nullptr) {
      // probe reference finite element
      LF_ASSERT_MSG(rfs_tria_v_[component]->RefEl() == lf::base::RefEl::kTria(),
                    "wrong type for triangle in component" << component);
      // initialize number of shape functions associated to entitites.
      num_rsf_node_[component] =
          rfs_tria_v_[component]->NumRefShapeFunctions(2);
      num_rsf_edge_[component] =
          rfs_tria_v_[component]->NumRefShapeFunctions(1);
      num_rsf_tria_[component] =
          rfs_tria_v_[component]->NumRefShapeFunctions(0);
    }
    if (rfs_quad_v_[component] != nullptr) {
      // probe reference finite element for quads.
      LF_ASSERT_MSG(rfs_quad_v_[component]->RefEl() == lf::base::RefEl::kQuad(),
                    "Wrong type for quad in component " << component);
      // initialize number of shape functions associated to entitites.
      num_rsf_node_[component] =
          rfs_quad_v_[component]->NumRefShapeFunctions(2);
      num_rsf_edge_[component] =
          rfs_quad_v_[component]->NumRefShapeFunctions(1);
      num_rsf_quad_[component] =
          rfs_quad_v_[component]->NumRefShapeFunctions(0);
    }
    if (rfs_edge_v_[component] != nullptr) {
      LF_ASSERT_MSG(
          rfs_edge_v_[component]->RefEl() == lf::base::RefEl::kSegment(),
          "Wrong type for edge in component " << component);
      num_rsf_node_[component] =
          rfs_edge_v_[component]->NumRefShapeFunctions(1);
      num_rsf_edge_[component] =
          rfs_edge_v_[component]->NumRefShapeFunctions(0);
    }

    // Compatibility check for numbers of local shape functions associated with
    // edges. Those must be the same for all reference shape function
    // descriptions in a component passed to the finite element space.
    if ((rfs_tria_v_[component] != nullptr) &&
        (rfs_quad_v_[component] != nullptr)) {
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(2)) ==
                        (rfs_quad_v_[component]->NumRefShapeFunctions(2)),
                    "#RSF missmatch on nodes in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(2)
                        << "<->"
                        << rfs_quad_v_[component]->NumRefShapeFunctions(2));
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(1)) ==
                        (rfs_quad_v_[component]->NumRefShapeFunctions(1)),
                    "#RSF missmatch on edges in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(1)
                        << "<->"
                        << rfs_quad_v_[component]->NumRefShapeFunctions(1));
    }
    if ((rfs_tria_v_[component] != nullptr) &&
        (rfs_edge_v_[component] != nullptr)) {
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(2)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(1)),
                    "#RSF missmatch on nodes in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(2)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(1));
      LF_ASSERT_MSG((rfs_tria_v_[component]->NumRefShapeFunctions(1)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(0)),
                    "#RSF missmatch on edges in component"
                        << component << ": "
                        << rfs_tria_v_[component]->NumRefShapeFunctions(1)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(0));
    }
    if ((rfs_quad_v_[component] != nullptr) &&
        (rfs_edge_v_[component] != nullptr)) {
      LF_ASSERT_MSG((rfs_quad_v_[component]->NumRefShapeFunctions(2)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(1)),
                    "#RSF missmatch on nodes in component"
                        << component << ": "
                        << rfs_quad_v_[component]->NumRefShapeFunctions(2)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(1));
      LF_ASSERT_MSG((rfs_quad_v_[component]->NumRefShapeFunctions(1)) ==
                        (rfs_edge_v_[component]->NumRefShapeFunctions(0)),
                    "#RSF missmatch on edges in component"
                        << component << ": "
                        << rfs_quad_v_[component]->NumRefShapeFunctions(1)
                        << "<->"
                        << rfs_edge_v_[component]->NumRefShapeFunctions(0));
    }
  }

  // initialization of dof handler
  // collect the number of interior reference shape functions for all
  // components
  std::vector<dof_map_t> rsf_layouts(numComponents_);
  for (size_type component = 0; component < numComponents_; component++) {
    rsf_layouts[component] = {
        {lf::base::RefEl::kPoint(), num_rsf_node_[component]},
        {lf::base::RefEl::kSegment(), num_rsf_edge_[component]},
        {lf::base::RefEl::kTria(), num_rsf_tria_[component]},
        {lf::base::RefEl::kQuad(), num_rsf_quad_[component]}};
  }
  dofh_p_ = std::make_unique<ProductUniformFEDofHandler>(mesh_p_, rsf_layouts);
}